

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O1

int Cudd_zddPrintCover(DdManager *zdd,DdNode *node)

{
  int iVar1;
  int *list;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  iVar1 = zdd->sizeZ;
  uVar4 = (ulong)iVar1;
  iVar3 = 0;
  if ((uVar4 & 1) == 0) {
    list = (int *)malloc(uVar4 * 4);
    if (list == (int *)0x0) {
      zdd->errorCode = CUDD_MEMORY_OUT;
      iVar3 = 0;
    }
    else {
      if (0 < iVar1) {
        uVar2 = 0;
        do {
          list[uVar2] = 3;
          uVar2 = uVar2 + 1;
        } while (uVar4 != uVar2);
      }
      zddPrintCoverAux(zdd,node,0,list);
      free(list);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int
Cudd_zddPrintCover(
  DdManager * zdd,
  DdNode * node)
{
    int         i, size;
    int         *list;

    size = (int)zdd->sizeZ;
    if (size % 2 != 0) return(0); /* number of variables should be even */
    list = ABC_ALLOC(int, size);
    if (list == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (i = 0; i < size; i++) list[i] = 3; /* bogus value should disappear */
    zddPrintCoverAux(zdd, node, 0, list);
    ABC_FREE(list);
    return(1);

}